

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

void nts(frameex1 *fxp)

{
  fnhead *local_18;
  fnhead *nt;
  frameex1 *fxp_local;
  
  if ((*(ushort *)&fxp->field_0x2 >> 9 & 1) == 0) {
    local_18 = (fnhead *)NativeAligned4FromLAddr(fxp->fnheader);
  }
  else {
    local_18 = (fnhead *)NativeAligned4FromLAddr(fxp->nametable);
  }
  ntheader(local_18);
  return;
}

Assistant:

void nts(struct frameex1 *fxp) {
  struct fnhead *nt;

#ifdef BIGVM
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->nametable);
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->fnheader);
#else
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2nametable) << 16 | fxp->lonametable));
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2fnheader) << 16 | fxp->lofnheader));
#endif /* BIGVM */
  ntheader(nt);
}